

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh.cxx
# Opt level: O1

void __thiscall xray_re::xr_mesh::load(xr_mesh *this,xr_reader *r,xr_object *object)

{
  pointer *pp_Var1;
  xr_vmap_vec *pxVar2;
  uint *puVar3;
  uint8_t *puVar4;
  iterator __position;
  iterator __position_00;
  ushort *puVar5;
  pointer ppxVar6;
  pointer plVar7;
  lw_vmref_entry lVar8;
  size_t sVar9;
  char *name;
  xr_vmap *pxVar10;
  pointer plVar11;
  ulong uVar12;
  f_read_2 *this_00;
  f_read_1 *this_01;
  ulong uVar13;
  ulong uVar14;
  const_pointer p;
  long lVar15;
  uint16_t version;
  short local_72;
  xr_surfmap *local_70;
  anon_union_24_2_ecfd7102_for_lw_face_0 local_68;
  uint32_t uStack_50;
  uint32_t uStack_4c;
  undefined4 uStack_48;
  uint uStack_44;
  undefined4 local_40;
  xr_object *local_38;
  
  sVar9 = xr_reader::r_raw_chunk(r,0x1000,&local_72,2);
  if (sVar9 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                  ,0xe6,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
  }
  if (local_72 != 0x11) {
    __assert_fail("version == EMESH_VERSION",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                  ,0xe7,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
  }
  sVar9 = xr_reader::find_chunk(r,0x1001);
  if (sVar9 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                  ,0xea,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
  }
  xr_reader::r_sz(r,&this->m_name);
  sVar9 = xr_reader::r_raw_chunk(r,0x1004,&this->m_bbox,0x18);
  if (sVar9 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                  ,0xee,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
  }
  sVar9 = xr_reader::r_raw_chunk(r,0x1002,&this->m_flags,1);
  if (sVar9 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                  ,0xf1,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
  }
  local_38 = object;
  xr_reader::r_raw_chunk(r,0x1010,&this->m_options,8);
  sVar9 = xr_reader::find_chunk(r,0x1005);
  if (sVar9 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                  ,0x10a,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
  }
  puVar3 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
  uVar14 = (ulong)*puVar3;
  std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::reserve
            (&this->m_points,uVar14);
  std::vector<xray_re::_vector3<float>,std::allocator<xray_re::_vector3<float>>>::
  _M_assign_aux<xray_re::_vector3<float>const*>
            ((vector<xray_re::_vector3<float>,std::allocator<xray_re::_vector3<float>>> *)
             &this->m_points,puVar3 + 1,puVar3 + uVar14 * 3 + 1);
  puVar4 = (r->field_2).m_p;
  (r->field_2).m_p = puVar4 + uVar14 * 0xc;
  if (r->m_end < puVar4 + uVar14 * 0xc) {
LAB_0017204c:
    __assert_fail("m_p <= m_end",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.h"
                  ,0x7c,"void xray_re::xr_reader::advance(size_t)");
  }
  sVar9 = xr_reader::find_chunk(r,0x1006);
  if (sVar9 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                  ,0x110,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
  }
  puVar3 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
  uVar14 = (ulong)*puVar3;
  std::vector<xray_re::lw_face,_std::allocator<xray_re::lw_face>_>::reserve(&this->m_faces,uVar14);
  if (uVar14 != 0) {
    do {
      __position._M_current =
           (this->m_faces).super__Vector_base<xray_re::lw_face,_std::allocator<xray_re::lw_face>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_faces).super__Vector_base<xray_re::lw_face,_std::allocator<xray_re::lw_face>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<xray_re::lw_face,_std::allocator<xray_re::lw_face>_>::
        _M_realloc_insert<xray_re::lw_face>(&this->m_faces,__position,(lw_face *)&local_68.field_0);
      }
      else {
        (this->m_faces).super__Vector_base<xray_re::lw_face,_std::allocator<xray_re::lw_face>_>.
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar14 = uVar14 - 1;
      read_face::operator()
                ((read_face *)&local_70,
                 (this->m_faces).
                 super__Vector_base<xray_re::lw_face,_std::allocator<xray_re::lw_face>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1,r);
    } while (uVar14 != 0);
  }
  sVar9 = xr_reader::find_chunk(r,0x1013);
  if (sVar9 != 0) {
    lVar15 = (long)(this->m_faces).
                   super__Vector_base<xray_re::lw_face,_std::allocator<xray_re::lw_face>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->m_faces).
                   super__Vector_base<xray_re::lw_face,_std::allocator<xray_re::lw_face>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    if (sVar9 != lVar15 * -0x5555555555555554) {
      __assert_fail("size == m_faces.size()*sizeof(uint32_t)",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                    ,0x115,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
    }
    puVar4 = (r->field_2).m_p;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              (&this->m_sgroups,lVar15 * -0x5555555555555555);
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->m_sgroups,puVar4,
               puVar4 + lVar15 * -0x5555555555555554);
    puVar4 = (r->field_2).m_p;
    (r->field_2).m_p = puVar4 + lVar15 * -0x5555555555555554;
    if (r->m_end < puVar4 + lVar15 * -0x5555555555555554) goto LAB_0017204c;
  }
  sVar9 = xr_reader::find_chunk(r,0x1008);
  if (sVar9 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                  ,0x11b,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
  }
  puVar3 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
  uVar14 = (ulong)*puVar3;
  std::
  vector<xray_re::_svector<xray_re::lw_vmref_entry,_5U>,_std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,_5U>_>_>
  ::reserve(&this->m_vmrefs,uVar14);
  if (uVar14 != 0) {
    do {
      local_40 = 0;
      __position_00._M_current =
           (this->m_vmrefs).
           super__Vector_base<xray_re::_svector<xray_re::lw_vmref_entry,_5U>,_std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,_5U>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (this->m_vmrefs).
          super__Vector_base<xray_re::_svector<xray_re::lw_vmref_entry,_5U>,_std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,_5U>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<xray_re::_svector<xray_re::lw_vmref_entry,5u>,std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,5u>>>
        ::_M_realloc_insert<xray_re::_svector<xray_re::lw_vmref_entry,5u>>
                  ((vector<xray_re::_svector<xray_re::lw_vmref_entry,5u>,std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,5u>>>
                    *)&this->m_vmrefs,__position_00,
                   (_svector<xray_re::lw_vmref_entry,_5U> *)&local_68.field_0);
      }
      else {
        lVar8.offset = uStack_4c;
        lVar8.vmap = uStack_50;
        *(ulong *)&(__position_00._M_current)->array[3].offset = CONCAT44(uStack_48,uStack_4c);
        *(ulong *)&(__position_00._M_current)->array[4].offset = (ulong)uStack_44;
        (__position_00._M_current)->array[2].vmap = local_68._16_4_;
        (__position_00._M_current)->array[2].offset = local_68.field_0.ref[2];
        (__position_00._M_current)->array[3] = lVar8;
        (__position_00._M_current)->array[0].vmap = local_68._0_4_;
        (__position_00._M_current)->array[0].offset = local_68.field_0.v[1];
        (__position_00._M_current)->array[1].vmap = local_68._8_4_;
        (__position_00._M_current)->array[1].offset = local_68.field_0.ref[0];
        pp_Var1 = &(this->m_vmrefs).
                   super__Vector_base<xray_re::_svector<xray_re::lw_vmref_entry,_5U>,_std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,_5U>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pp_Var1 = *pp_Var1 + 1;
      }
      uVar14 = uVar14 - 1;
      read_vmref::operator()
                ((read_vmref *)&local_70,
                 (this->m_vmrefs).
                 super__Vector_base<xray_re::_svector<xray_re::lw_vmref_entry,_5U>,_std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,_5U>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1,r);
    } while (uVar14 != 0);
  }
  sVar9 = xr_reader::find_chunk(r,0x1009);
  if (sVar9 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                  ,0x120,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
  }
  puVar5 = (r->field_2).m_p_u16;
  (r->field_2).m_p = (uint8_t *)(puVar5 + 1);
  uVar14 = (ulong)*puVar5;
  local_68._0_8_ = local_38;
  std::vector<xray_re::xr_surfmap_*,_std::allocator<xray_re::xr_surfmap_*>_>::reserve
            (&this->m_surfmaps,uVar14);
  if (uVar14 != 0) {
    do {
      local_70 = (xr_surfmap *)0x0;
      std::vector<xray_re::xr_surfmap*,std::allocator<xray_re::xr_surfmap*>>::
      emplace_back<xray_re::xr_surfmap*>
                ((vector<xray_re::xr_surfmap*,std::allocator<xray_re::xr_surfmap*>> *)
                 &this->m_surfmaps,&local_70);
      read_surfmap::operator()
                ((read_surfmap *)&local_68.field_0,
                 (this->m_surfmaps).
                 super__Vector_base<xray_re::xr_surfmap_*,_std::allocator<xray_re::xr_surfmap_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish + -1,r);
      uVar14 = uVar14 - 1;
    } while (uVar14 != 0);
  }
  sVar9 = xr_reader::find_chunk(r,0x1012);
  if (sVar9 == 0) {
    sVar9 = xr_reader::find_chunk(r,0x1011);
    if (sVar9 == 0) {
      sVar9 = xr_reader::find_chunk(r,0x1007);
      if (sVar9 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                      ,299,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
      }
      puVar3 = (r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
      uVar14 = (ulong)*puVar3;
      std::vector<xray_re::xr_vmap_*,_std::allocator<xray_re::xr_vmap_*>_>::reserve
                (&this->m_vmaps,uVar14);
      if (uVar14 != 0) {
        do {
          local_68._0_8_ = (xr_object *)0x0;
          std::vector<xray_re::xr_vmap*,std::allocator<xray_re::xr_vmap*>>::
          emplace_back<xray_re::xr_vmap*>
                    ((vector<xray_re::xr_vmap*,std::allocator<xray_re::xr_vmap*>> *)&this->m_vmaps,
                     (xr_vmap **)&local_68);
          ppxVar6 = (this->m_vmaps).
                    super__Vector_base<xray_re::xr_vmap_*,_std::allocator<xray_re::xr_vmap_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          name = xr_reader::skip_sz(r);
          pxVar10 = xr_vmap::create(name,0,2,false);
          ppxVar6[-1] = pxVar10;
          (*pxVar10->_vptr_xr_vmap[2])(pxVar10,r);
          uVar14 = uVar14 - 1;
        } while (uVar14 != 0);
      }
    }
    else {
      puVar3 = (r->field_2).m_p_u32;
      (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
      uVar14 = (ulong)*puVar3;
      pxVar2 = &this->m_vmaps;
      std::vector<xray_re::xr_vmap_*,_std::allocator<xray_re::xr_vmap_*>_>::reserve(pxVar2,uVar14);
      if (uVar14 != 0) {
        do {
          local_68._0_8_ = (xr_object *)0x0;
          this_01 = (f_read_1 *)pxVar2;
          std::vector<xray_re::xr_vmap*,std::allocator<xray_re::xr_vmap*>>::
          emplace_back<xray_re::xr_vmap*>
                    ((vector<xray_re::xr_vmap*,std::allocator<xray_re::xr_vmap*>> *)pxVar2,
                     (xr_vmap **)&local_68);
          xr_vmap::f_read_1::operator()
                    (this_01,(this->m_vmaps).
                             super__Vector_base<xray_re::xr_vmap_*,_std::allocator<xray_re::xr_vmap_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish + -1,r);
          uVar14 = uVar14 - 1;
        } while (uVar14 != 0);
      }
    }
  }
  else {
    puVar3 = (r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
    uVar14 = (ulong)*puVar3;
    pxVar2 = &this->m_vmaps;
    std::vector<xray_re::xr_vmap_*,_std::allocator<xray_re::xr_vmap_*>_>::reserve(pxVar2,uVar14);
    if (uVar14 != 0) {
      do {
        local_68._0_8_ = (xr_object *)0x0;
        this_00 = (f_read_2 *)pxVar2;
        std::vector<xray_re::xr_vmap*,std::allocator<xray_re::xr_vmap*>>::
        emplace_back<xray_re::xr_vmap*>
                  ((vector<xray_re::xr_vmap*,std::allocator<xray_re::xr_vmap*>> *)pxVar2,
                   (xr_vmap **)&local_68);
        xr_vmap::f_read_2::operator()
                  (this_00,(this->m_vmaps).
                           super__Vector_base<xray_re::xr_vmap_*,_std::allocator<xray_re::xr_vmap_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish + -1,r);
        uVar14 = uVar14 - 1;
      } while (uVar14 != 0);
    }
  }
  plVar11 = (this->m_faces).super__Vector_base<xray_re::lw_face,_std::allocator<xray_re::lw_face>_>.
            _M_impl.super__Vector_impl_data._M_start;
  plVar7 = (this->m_faces).super__Vector_base<xray_re::lw_face,_std::allocator<xray_re::lw_face>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (plVar11 != plVar7) {
    uVar14 = ((long)(this->m_points).
                    super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_points).
                    super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
    uVar12 = ((long)(this->m_vmrefs).
                    super__Vector_base<xray_re::_svector<xray_re::lw_vmref_entry,_5U>,_std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,_5U>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_vmrefs).
                    super__Vector_base<xray_re::_svector<xray_re::lw_vmref_entry,_5U>,_std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,_5U>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 2) * 0x2e8ba2e8ba2e8ba3;
    do {
      uVar13 = (ulong)(plVar11->field_0).field_0.v[0];
      if (uVar14 < uVar13 || uVar14 - uVar13 == 0) {
        __assert_fail("it->v0 < m_points.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                      ,0x130,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
      }
      uVar13 = (ulong)(plVar11->field_0).field_0.v[1];
      if (uVar14 < uVar13 || uVar14 - uVar13 == 0) {
        __assert_fail("it->v1 < m_points.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                      ,0x131,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
      }
      uVar13 = (ulong)(plVar11->field_0).field_0.v[2];
      if (uVar14 < uVar13 || uVar14 - uVar13 == 0) {
        __assert_fail("it->v2 < m_points.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                      ,0x132,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
      }
      uVar13 = (ulong)(plVar11->field_0).field_0.ref[0];
      if (uVar12 < uVar13 || uVar12 - uVar13 == 0) {
        __assert_fail("it->ref0 < m_vmrefs.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                      ,0x133,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
      }
      uVar13 = (ulong)(plVar11->field_0).field_0.ref[1];
      if (uVar12 < uVar13 || uVar12 - uVar13 == 0) {
        __assert_fail("it->ref1 < m_vmrefs.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                      ,0x134,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
      }
      uVar13 = (ulong)(plVar11->field_0).field_0.ref[2];
      if (uVar12 < uVar13 || uVar12 - uVar13 == 0) {
        __assert_fail("it->ref2 < m_vmrefs.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh.cxx"
                      ,0x135,"void xray_re::xr_mesh::load(xr_reader &, xr_object &)");
      }
      plVar11 = plVar11 + 1;
    } while (plVar11 != plVar7);
  }
  return;
}

Assistant:

void xr_mesh::load(xr_reader& r, xr_object& object)
{
	size_t size;

	uint16_t version;
	if (!r.r_chunk<uint16_t>(EMESH_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == EMESH_VERSION);

	if (!r.r_chunk(EMESH_CHUNK_MESHNAME, m_name))
		xr_not_expected();
	r.debug_find_chunk();

	if (!r.r_chunk<fbox>(EMESH_CHUNK_BBOX, m_bbox))
		xr_not_expected();

	if (!r.r_chunk<uint8_t>(EMESH_CHUNK_FLAGS, m_flags))
		xr_not_expected();

	r.r_chunk<lw_options>(EMESH_CHUNK_OPTIONS, m_options);

#if 0
	if (!(size = r.find_chunk(EMESH_CHUNK_VERTS)))
		xr_not_expected();
	r.r_seq(r.r_u32(), m_points);
//	if (m_flags & EMF_3DSMAX) {
//		xr_assert(m_points.size()*sizeof(fvector3) < size);
	if (m_points.size()*sizeof(fvector3) < size) {
		m_adj_counts.reserve(m_points.size());
		m_adj_refs.reserve(m_points.size());
		while (size) {
			uint8_t n = r.r_u8();
			m_adj_counts.push_back(n);
			xr_assert(size >= n*sizeof(uint32_t) + sizeof(uint8_t));
			size -= n*sizeof(uint32_t) + sizeof(uint8_t)
			while (n--)
				m_adj_refs.push_back(r.r_u32());
		}
	}
	r.debug_find_chunk();
#else
	if (!r.find_chunk(EMESH_CHUNK_VERTS))
		xr_not_expected();
	r.r_seq(r.r_u32(), m_points);
	// adjacency data is ignored by AE/xrECoreB.dll as well
#endif

	if (!r.find_chunk(EMESH_CHUNK_FACES))
		xr_not_expected();
	r.r_seq(r.r_u32(), m_faces, read_face());
	r.debug_find_chunk();

	if ((size = r.find_chunk(EMESH_CHUNK_SG))) {
		xr_assert(size == m_faces.size()*sizeof(uint32_t));
		r.r_seq(m_faces.size(), m_sgroups);
		r.debug_find_chunk();
	}

	if (!r.find_chunk(EMESH_CHUNK_VMREFS))
		xr_not_expected();
	r.r_seq(r.r_u32(), m_vmrefs, read_vmref());
	r.debug_find_chunk();

	if (!r.find_chunk(EMESH_CHUNK_SFACE))
		xr_not_expected();
	r.r_seq(r.r_u16(), m_surfmaps, read_surfmap(object));
	r.debug_find_chunk();

	if (r.find_chunk(EMESH_CHUNK_VMAPS_2)) {
		r.r_seq(r.r_u32(), m_vmaps, xr_vmap::f_read_2());
	} else if (r.find_chunk(EMESH_CHUNK_VMAPS_1)) {
		r.r_seq(r.r_u32(), m_vmaps, xr_vmap::f_read_1());
	} else if (r.find_chunk(EMESH_CHUNK_VMAPS_0)) {
		r.r_seq(r.r_u32(), m_vmaps, xr_vmap::f_read_0());
	} else {
		xr_not_expected();
	}
	r.debug_find_chunk();
#if 1
	for (lw_face_vec_it it = m_faces.begin(); it != m_faces.end(); ++it) {
		xr_assert(it->v0 < m_points.size());
		xr_assert(it->v1 < m_points.size());
		xr_assert(it->v2 < m_points.size());
		xr_assert(it->ref0 < m_vmrefs.size());
		xr_assert(it->ref1 < m_vmrefs.size());
		xr_assert(it->ref2 < m_vmrefs.size());
	}
#endif
}